

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forkFFT.c
# Opt level: O2

complex line_to_number(char *line)

{
  int iVar1;
  int *piVar2;
  undefined8 extraout_RAX;
  undefined8 extraout_RDX;
  char *__ptr;
  complex auVar3;
  size_t sStack_30;
  char *line_local;
  
  line_local = line;
  iVar1 = regexec((regex_t *)&preg,line,0,(regmatch_t *)0x0,0);
  if (iVar1 == 1) {
    fprintf(_stderr,"%s ERROR: ",fileName);
    __ptr = "invalid complex number";
    sStack_30 = 0x16;
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0;
    strtof(line,&line_local);
    if (*piVar2 == 0) {
      strtof(line_local,&line_local);
      if (*piVar2 == 0) {
        auVar3._8_8_ = extraout_RDX;
        auVar3._0_8_ = extraout_RAX;
        return auVar3;
      }
    }
    fprintf(_stderr,"%s ERROR: ",fileName);
    __ptr = "invalid number";
    sStack_30 = 0xe;
  }
  fwrite(__ptr,sStack_30,1,_stderr);
  fputc(10,_stderr);
  exit(1);
}

Assistant:

static double complex line_to_number(char* line){
    double complex ret = 0;

    check_for_number(line);

    errno = 0;
    ret = strtof(line, &line);
    if (!(*line != '\n' || *line != ' ') || errno != 0)
    {
        ERROR_EXIT("invalid number");
    }
    ret += strtof(line, &line) * I;

    if (!(*line != '\n' || *line != ' ') || errno != 0)
    {
        ERROR_EXIT("invalid number");
    }

    return ret;
}